

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rnn-state-machine.h
# Opt level: O0

void __thiscall cnn::RNNStateMachine::transition(RNNStateMachine *this,RNNOp op)

{
  uint in_ESI;
  int *in_RDI;
  RNNOp op_00;
  int iVar1;
  
  iVar1 = *in_RDI;
  op_00 = (RNNOp)((ulong)in_RDI >> 0x20);
  if (iVar1 == 0) {
    if (in_ESI == 0) {
      *in_RDI = 1;
      return;
    }
    failure((RNNStateMachine *)((ulong)in_ESI << 0x20),op_00);
  }
  else if (iVar1 != 1) {
    if (iVar1 != 2) {
      return;
    }
    goto LAB_003a5251;
  }
  if (in_ESI == 0) {
    return;
  }
  if (in_ESI == 1) {
    *in_RDI = 2;
    return;
  }
  failure((RNNStateMachine *)CONCAT44(in_ESI,iVar1),op_00);
LAB_003a5251:
  if ((in_ESI != 2) && (in_ESI != 1)) {
    if (in_ESI == 0) {
      *in_RDI = 1;
    }
    else {
      failure((RNNStateMachine *)CONCAT44(in_ESI,iVar1),op_00);
    }
  }
  return;
}

Assistant:

void transition(RNNOp op) {
    switch (q_) {
      case RNNState::CREATED:
        if (op == RNNOp::new_graph) { q_ = RNNState::GRAPH_READY; break; }
        failure(op);
      case RNNState::GRAPH_READY:
        if (op == RNNOp::new_graph) { break; }
        if (op == RNNOp::start_new_sequence) { q_ = RNNState::READING_INPUT; break; }
        failure(op);
      case RNNState::READING_INPUT:
        if (op == RNNOp::add_input) { break; }
        if (op == RNNOp::start_new_sequence) { break; }
        if (op == RNNOp::new_graph) { q_ = RNNState::GRAPH_READY; break; }
        failure(op);
    }
  }